

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

void Curl_cf_def_get_host
               (Curl_cfilter *cf,Curl_easy *data,char **phost,char **pdisplay_host,int *pport)

{
  Curl_cfilter *pCVar1;
  
  pCVar1 = cf->next;
  if (pCVar1 != (Curl_cfilter *)0x0) {
    (*pCVar1->cft->get_host)(pCVar1,data,phost,pdisplay_host,pport);
    return;
  }
  *phost = (cf->conn->host).name;
  *pdisplay_host = (cf->conn->host).dispname;
  *pport = (cf->conn->primary).remote_port;
  return;
}

Assistant:

void Curl_cf_def_get_host(struct Curl_cfilter *cf, struct Curl_easy *data,
                          const char **phost, const char **pdisplay_host,
                          int *pport)
{
  if(cf->next)
    cf->next->cft->get_host(cf->next, data, phost, pdisplay_host, pport);
  else {
    *phost = cf->conn->host.name;
    *pdisplay_host = cf->conn->host.dispname;
    *pport = cf->conn->primary.remote_port;
  }
}